

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkStats.h
# Opt level: O3

void Corrade::TestSuite::Implementation::printStats
               (Debug *out,double mean,double stddev,Color color,BenchmarkUnits unit)

{
  undefined8 uVar1;
  char *unit_00;
  char *unitPrefix;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  Debug local_30 [40];
  
  switch(unit) {
  case Nanoseconds:
    dVar4 = stddev;
    if (stddev <= mean) {
      dVar4 = mean;
    }
    if (1000000000.0 <= dVar4) {
      unitPrefix = " ";
      unit_00 = "s";
      goto LAB_001120d4;
    }
    if (1000000.0 <= dVar4) {
      unitPrefix = "m";
      unit_00 = "s";
      goto LAB_0011214d;
    }
    if (dVar4 < 1000.0) {
      unitPrefix = "n";
      unit_00 = "s";
      break;
    }
    unitPrefix = anon_var_dwarf_102eb;
    unit_00 = "s";
    goto LAB_001121ad;
  case Cycles:
    dVar4 = stddev;
    if (stddev <= mean) {
      dVar4 = mean;
    }
    if (1000000000.0 <= dVar4) {
      unitPrefix = "G";
      unit_00 = "C";
      goto LAB_001120d4;
    }
    if (1000000.0 <= dVar4) {
      unitPrefix = "M";
      unit_00 = "C";
      goto LAB_0011214d;
    }
    if (1000.0 <= dVar4) {
      unitPrefix = "k";
      unit_00 = "C";
      goto LAB_001121ad;
    }
    unitPrefix = " ";
    unit_00 = "C";
    break;
  case Instructions:
    dVar4 = stddev;
    if (stddev <= mean) {
      dVar4 = mean;
    }
    if (1000000000.0 <= dVar4) {
      unitPrefix = "G";
      unit_00 = "I";
      goto LAB_001120d4;
    }
    if (1000000.0 <= dVar4) {
      unitPrefix = "M";
      unit_00 = "I";
      goto LAB_0011214d;
    }
    if (1000.0 <= dVar4) {
      unitPrefix = "k";
      unit_00 = "I";
      goto LAB_001121ad;
    }
    unitPrefix = " ";
    unit_00 = "I";
    break;
  case Bytes:
    dVar4 = stddev;
    if (stddev <= mean) {
      dVar4 = mean;
    }
    if (1073741824.0 <= dVar4) {
      unitPrefix = "G";
      unit_00 = "B";
      dVar4 = 1073741824.0;
      goto LAB_001121b5;
    }
    if (1048576.0 <= dVar4) {
      unitPrefix = "M";
      unit_00 = "B";
      dVar4 = 1048576.0;
      goto LAB_001121b5;
    }
    if (1024.0 <= dVar4) {
      unitPrefix = "k";
      unit_00 = "B";
      dVar4 = 1024.0;
      goto LAB_001121b5;
    }
    unitPrefix = " ";
    unit_00 = "B";
    break;
  case Count:
    goto switchD_00111e6d_caseD_68;
  case RatioThousandths:
    auVar2._8_8_ = stddev;
    auVar2._0_8_ = mean;
    auVar3 = divpd(auVar2,_DAT_001181f0);
    mean = auVar3._0_8_;
    stddev = auVar3._8_8_;
    goto switchD_00111e6d_caseD_68;
  case PercentageThousandths:
    auVar3._8_8_ = stddev;
    auVar3._0_8_ = mean;
    auVar3 = divpd(auVar3,_DAT_001181f0);
    stddev = auVar3._8_8_;
    mean = auVar3._0_8_;
    dVar4 = stddev;
    if (stddev <= mean) {
      dVar4 = mean;
    }
    if (1000000000.0 <= dVar4) {
      unitPrefix = "G";
      unit_00 = "%";
      goto LAB_001120d4;
    }
    if (1000000.0 <= dVar4) {
      unitPrefix = "M";
      unit_00 = "%";
      goto LAB_0011214d;
    }
    if (1000.0 <= dVar4) {
      unitPrefix = "k";
      unit_00 = "%";
      goto LAB_001121ad;
    }
    unitPrefix = " ";
    unit_00 = "%";
    break;
  default:
    uVar1 = Corrade::Utility::Error::defaultOutput();
    Corrade::Utility::Error::Error((Error *)local_30,uVar1,0);
    Corrade::Utility::Debug::operator<<
              (local_30,
               "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/TestSuite/Implementation/BenchmarkStats.h:150"
              );
    Corrade::Utility::Error::~Error((Error *)local_30);
    abort();
  }
  dVar4 = 1.0;
LAB_001121b5:
  printValue(out,mean,stddev,color,dVar4,unitPrefix,unit_00);
  return;
switchD_00111e6d_caseD_68:
  dVar4 = stddev;
  if (stddev <= mean) {
    dVar4 = mean;
  }
  if (1000000000.0 <= dVar4) {
    unitPrefix = "G";
    unit_00 = " ";
LAB_001120d4:
    dVar4 = 1000000000.0;
  }
  else if (1000000.0 <= dVar4) {
    unitPrefix = "M";
    unit_00 = " ";
LAB_0011214d:
    dVar4 = 1000000.0;
  }
  else if (1000.0 <= dVar4) {
    unitPrefix = "k";
    unit_00 = " ";
LAB_001121ad:
    dVar4 = 1000.0;
  }
  else {
    unit_00 = " ";
    dVar4 = 1.0;
    unitPrefix = " ";
  }
  goto LAB_001121b5;
}

Assistant:

inline void printStats(Utility::Debug& out, const double mean, const double stddev, const Utility::Debug::Color color, const Tester::BenchmarkUnits unit) {
    switch(unit) {
        case Tester::BenchmarkUnits::Nanoseconds:
            printTime(out, mean, stddev, color);
            return;
        case Tester::BenchmarkUnits::Cycles:
            printCount(out, mean, stddev, color, 1000.0, "C");
            return;
        case Tester::BenchmarkUnits::Instructions:
            printCount(out, mean, stddev, color, 1000.0, "I");
            return;
        case Tester::BenchmarkUnits::Bytes:
            printCount(out, mean, stddev, color, 1024.0, "B");
            return;
        case Tester::BenchmarkUnits::Count:
            printCount(out, mean, stddev, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::RatioThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::PercentageThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, "%");
            return;
    }

    CORRADE_INTERNAL_ASSERT_UNREACHABLE(); /* LCOV_EXCL_LINE */
}